

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.h
# Opt level: O0

ChCoordsys<double> * __thiscall
chrono::ChLinkMarkers::GetLinkRelativeCoords
          (ChCoordsys<double> *__return_storage_ptr__,ChLinkMarkers *this)

{
  ChCoordsys<double> *other;
  ChLinkMarkers *this_local;
  
  other = ChFrame<double>::GetCoord((ChFrame<double> *)(*(long *)(this + 0xc0) + 0x38));
  ChCoordsys<double>::ChCoordsys(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

virtual ChCoordsys<> GetLinkRelativeCoords() override { return marker2->GetCoord(); }